

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::TestDynamicExtensions::ByteSizeLong(TestDynamicExtensions *this)

{
  uint uVar1;
  int iVar2;
  ForeignEnum value;
  TestDynamicExtensions_DynamicEnumType value_00;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar3;
  const_reference value_01;
  size_t sVar4;
  RepeatedField<int> *value_02;
  uint32_t *puVar5;
  int local_60;
  int n;
  int i;
  uint32_t cached_has_bits;
  size_t total_size;
  TestDynamicExtensions *this_;
  TestDynamicExtensions *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  pRVar3 = _internal_repeated_extension_abi_cxx11_(this);
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar3);
  _i = google::protobuf::internal::FromIntSize(iVar2);
  _i = _i * 2;
  local_60 = 0;
  pRVar3 = _internal_repeated_extension_abi_cxx11_(this);
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(pRVar3);
  for (; local_60 < iVar2; local_60 = local_60 + 1) {
    pRVar3 = _internal_repeated_extension_abi_cxx11_(this);
    value_01 = google::protobuf::
               RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::Get(pRVar3,local_60);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(value_01);
    _i = sVar4 + _i;
  }
  value_02 = _internal_packed_extension(this);
  sVar4 = google::protobuf::internal::WireFormatLite::SInt32SizeWithPackedTagSize
                    (value_02,2,&(this->field_0)._impl_._packed_extension_cached_byte_size_);
  puVar5 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar5;
  _i = (long)(int)((uint)((uVar1 & 4) != 0) * 6) + sVar4 + _i;
  if ((uVar1 & 0x1b) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::ForeignMessage>
                        ((this->field_0)._impl_.message_extension_);
      _i = sVar4 + 2 + _i;
    }
    if ((uVar1 & 2) != 0) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::TestDynamicExtensions_DynamicMessageType>
                        ((this->field_0)._impl_.dynamic_message_extension_);
      _i = sVar4 + 2 + _i;
    }
    if ((uVar1 & 8) != 0) {
      value = _internal_enum_extension(this);
      sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(value);
      _i = sVar4 + 2 + _i;
    }
    if ((uVar1 & 0x10) != 0) {
      value_00 = _internal_dynamic_enum_extension(this);
      sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(value_00);
      _i = sVar4 + 2 + _i;
    }
  }
  sVar4 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,_i,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t TestDynamicExtensions::ByteSizeLong() const {
  const TestDynamicExtensions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestDynamicExtensions)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated string repeated_extension = 2005;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_extension().size());
      for (int i = 0, n = this_._internal_repeated_extension().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_extension().Get(i));
      }
    }
    // repeated sint32 packed_extension = 2006 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::SInt32SizeWithPackedTagSize(
              this_._internal_packed_extension(), 2,
              this_._impl_._packed_extension_cached_byte_size_);
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += static_cast<bool>(0x00000004u & cached_has_bits) * 6;
  if ((cached_has_bits & 0x0000001bu) != 0) {
    // .proto2_unittest.ForeignMessage message_extension = 2003;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.message_extension_);
    }
    // .proto2_unittest.TestDynamicExtensions.DynamicMessageType dynamic_message_extension = 2004;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.dynamic_message_extension_);
    }
    // .proto2_unittest.ForeignEnum enum_extension = 2001;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_enum_extension());
    }
    // .proto2_unittest.TestDynamicExtensions.DynamicEnumType dynamic_enum_extension = 2002;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_dynamic_enum_extension());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}